

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bocsu.cpp
# Opt level: O3

UChar32 u_writeIdenticalLevelRun_63(UChar32 prev,UChar *s,int32_t length,ByteSink *sink)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  char cVar10;
  uint uVar11;
  int32_t capacity;
  char scratch [64];
  uint local_88;
  uint local_84;
  ByteSink *local_80;
  char local_78 [72];
  
  if (0 < length) {
    local_84 = length * 2;
    iVar5 = 0;
    local_80 = sink;
    do {
      iVar1 = (*local_80->_vptr_ByteSink[3])(local_80,1,(ulong)local_84,local_78,0x40,&local_88);
      pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
      if ((int)local_88 < 0x10) {
        local_88 = 0x40;
        pcVar2 = local_78;
      }
      pcVar3 = pcVar2;
      if (iVar5 < length) {
        do {
          if (pcVar2 + ((ulong)local_88 - 4) < pcVar3) break;
          uVar11 = prev & 0xffffff80U | 0x50;
          if (0xffffadff < prev - 0xa000U) {
            uVar11 = 0x7654;
          }
          iVar1 = iVar5 + 1;
          prev = (UChar32)(ushort)s[iVar5];
          if ((((prev & 0xfc00U) == 0xd800) && (iVar1 != length)) &&
             (lVar9 = (long)iVar1, ((ushort)s[lVar9] & 0xfc00) == 0xdc00)) {
            iVar1 = iVar5 + 2;
            prev = prev * 0x400 + (uint)(ushort)s[lVar9] + 0xfca02400;
LAB_0022183c:
            uVar11 = prev - uVar11;
            if ((int)uVar11 < -0x50) {
              if (uVar11 < 0xffffd654) {
                uVar7 = -uVar11 % 0xfd;
                cVar4 = -(char)uVar7;
                if (uVar7 == 0) {
                  cVar4 = '\x03';
                }
                uVar7 = (uint)(uVar7 != 0) + -uVar11 / 0xfd;
                if (uVar11 < 0xfffd0eee) {
                  pcVar3[3] = cVar4;
                  uVar11 = uVar7 % 0xfd;
                  cVar4 = -(char)uVar11;
                  if (uVar11 == 0) {
                    cVar4 = '\x03';
                  }
                  uVar11 = (uint)(uVar11 != 0) + uVar7 / 0xfd;
                  iVar5 = uVar11 + ((uVar11 & 0xffff) / 0xfd) * -0xfd;
                  cVar10 = -(char)iVar5;
                  if ((short)iVar5 == 0) {
                    cVar10 = '\x03';
                  }
                  pcVar3[2] = cVar4;
                  pcVar3[1] = cVar10;
                  *pcVar3 = '\x03';
                  pcVar3 = pcVar3 + 4;
                }
                else {
                  pcVar3[2] = cVar4;
                  uVar11 = (uVar7 & 0xffff) / 0xfd;
                  iVar5 = uVar7 + uVar11 * -0xfd;
                  bVar8 = (byte)uVar11;
                  cVar4 = -(char)iVar5;
                  bVar6 = ~bVar8;
                  if ((short)iVar5 == 0) {
                    cVar4 = '\x03';
                    bVar6 = -bVar8;
                  }
                  pcVar3[1] = cVar4;
                  *pcVar3 = bVar6 + 7;
                  pcVar3 = pcVar3 + 3;
                }
              }
              else {
                uVar7 = (-uVar11 & 0xffff) / 0xfd;
                iVar5 = -uVar11 + uVar7 * -0xfd;
                cVar4 = -(char)iVar5;
                bVar8 = (byte)uVar7;
                bVar6 = ~bVar8;
                if ((short)iVar5 == 0) {
                  cVar4 = '\x03';
                  bVar6 = -bVar8;
                }
                *pcVar3 = bVar6 + 0x31;
LAB_002218d4:
                pcVar3[1] = cVar4;
                pcVar3 = pcVar3 + 2;
              }
            }
            else {
              cVar4 = (char)uVar11;
              if ((int)uVar11 < 0x51) {
                *pcVar3 = cVar4 + -0x7f;
                pcVar3 = pcVar3 + 1;
              }
              else {
                if (uVar11 < 0x29ac) {
                  cVar10 = (char)((uVar11 & 0xffff) / 0xfd);
                  *pcVar3 = cVar10 + -0x2e;
                  cVar4 = cVar4 + cVar10 * '\x03' + '\x03';
                  goto LAB_002218d4;
                }
                cVar10 = cVar4 + (char)(uVar11 / 0xfd) * '\x03' + '\x03';
                cVar4 = (char)(uVar11 / 0xfd);
                if (uVar11 < 0x2f112) {
                  pcVar3[2] = cVar10;
                  pcVar3[1] = cVar4 + (char)((uVar11 / 0xfd & 0xffff) / 0xfd) * '\x03' + '\x03';
                  *pcVar3 = (char)(uVar11 / 0xfa09) + -4;
                  pcVar3 = pcVar3 + 3;
                }
                else {
                  pcVar3[3] = cVar10;
                  pcVar3[2] = cVar4 + (char)((uVar11 / 0xfd) / 0xfd) * '\x03' + '\x03';
                  pcVar3[1] = (char)(uVar11 / 0xfa09) +
                              (char)((uVar11 / 0xfa09 & 0xffff) / 0xfd) * '\x03' + '\x03';
                  *pcVar3 = -1;
                  pcVar3 = pcVar3 + 4;
                }
              }
            }
          }
          else {
            if (prev != 0xfffe) goto LAB_0022183c;
            *pcVar3 = '\x02';
            pcVar3 = pcVar3 + 1;
            prev = 0;
          }
          iVar5 = iVar1;
        } while (iVar1 < length);
      }
      (*local_80->_vptr_ByteSink[2])(local_80,pcVar2,(ulong)(uint)((int)pcVar3 - (int)pcVar2));
    } while (iVar5 < length);
  }
  return prev;
}

Assistant:

U_CFUNC UChar32
u_writeIdenticalLevelRun(UChar32 prev, const UChar *s, int32_t length, icu::ByteSink &sink) {
    char scratch[64];
    int32_t capacity;

    int32_t i=0;
    while(i<length) {
        char *buffer=sink.GetAppendBuffer(1, length*2, scratch, (int32_t)sizeof(scratch), &capacity);
        uint8_t *p;
        // We must have capacity>=SLOPE_MAX_BYTES in case u_writeDiff() writes that much,
        // but we do not want to force the sink.GetAppendBuffer() to allocate
        // for a large min_capacity because we might actually only write one byte.
        if(capacity<16) {
            buffer=scratch;
            capacity=(int32_t)sizeof(scratch);
        }
        p=reinterpret_cast<uint8_t *>(buffer);
        uint8_t *lastSafe=p+capacity-SLOPE_MAX_BYTES;
        while(i<length && p<=lastSafe) {
            if(prev<0x4e00 || prev>=0xa000) {
                prev=(prev&~0x7f)-SLOPE_REACH_NEG_1;
            } else {
                /*
                 * Unihan U+4e00..U+9fa5:
                 * double-bytes down from the upper end
                 */
                prev=0x9fff-SLOPE_REACH_POS_2;
            }

            UChar32 c;
            U16_NEXT(s, i, length, c);
            if(c==0xfffe) {
                *p++=2;  // merge separator
                prev=0;
            } else {
                p=u_writeDiff(c-prev, p);
                prev=c;
            }
        }
        sink.Append(buffer, (int32_t)(p-reinterpret_cast<uint8_t *>(buffer)));
    }
    return prev;
}